

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
::printFailureInfo(AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
                   *this,ostream *os)

{
  ostream *poVar1;
  ostream *this_00;
  Name name;
  ostream *os_local;
  AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  *this_local;
  
  poVar1 = std::operator<<(os,"Error for ");
  poVar1 = std::operator<<(poVar1,(string *)&this->txfnName);
  poVar1 = std::operator<<(poVar1," and ");
  poVar1 = std::operator<<(poVar1,(string *)&this->latticeName);
  poVar1 = std::operator<<(poVar1," at lattice element seed ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->latticeElementSeed);
  this_00 = std::operator<<(poVar1," and function ");
  poVar1 = (ostream *)(this->funcName).super_IString.str._M_len;
  name.super_IString.str._M_str = (char *)poVar1;
  name.super_IString.str._M_len = (size_t)(this->funcName).super_IString.str._M_str;
  poVar1 = wasm::operator<<((wasm *)this_00,poVar1,name);
  std::operator<<(poVar1,".\n");
  return;
}

Assistant:

void printFailureInfo(std::ostream& os) {
    os << "Error for " << txfnName << " and " << latticeName
       << " at lattice element seed " << latticeElementSeed << " and function "
       << funcName << ".\n";
  }